

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O3

void __thiscall
pobr::main::App::App
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  pointer pcVar1;
  bool bVar2;
  Mat *segments;
  ImgProcessor imgProcessor;
  string filepath;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  letterSegments;
  CmdParser cmdParser;
  Mat img;
  undefined4 local_1b0;
  undefined2 local_1ab;
  undefined1 local_1a9;
  undefined1 local_1a8 [32];
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  string local_140;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  local_120;
  CmdParser local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  undefined1 local_d8 [96];
  undefined1 local_78 [16];
  Size local_68;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f0,arguments);
  utils::CmdParser::CmdParser(&local_108,&local_f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f0);
  pcVar1 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"file","");
  utils::CmdParser::getFlagValue(&local_140,&local_108,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_);
  }
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"binary","");
  bVar2 = utils::CmdParser::hasFlag(&local_108,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_);
  }
  if (local_140._M_string_length == 0) {
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"No input file specified","");
    local_d8[0] = (Mat)0x0;
    utils::Logger::error((string *)local_1a8,(bool *)local_d8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_);
    }
  }
  local_158 = 0;
  uStack_150 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_1a8._16_8_ = 0;
  local_1a8._24_8_ = 0;
  local_1a8._0_8_ = (pointer)0x0;
  local_1a8._8_8_ = 0;
  cv::Mat::Mat((Mat *)local_1a8);
  imgProcessing::ImgProcessor::loadImg((ImgProcessor *)local_1a8,&local_140);
  imgProcessing::ImgProcessor::process(&local_120,(ImgProcessor *)local_1a8);
  if (bVar2) {
    imgProcessing::ImgProcessor::getBinarizedImg((ImgProcessor *)local_78);
    local_1ab = 0;
    local_1a9 = 0xff;
    local_1b0 = 3;
    imgProcessing::ImgProcessor::drawSegmentsBBoxes
              ((ImgProcessor *)local_d8,(Mat *)local_1a8,
               (vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                *)local_78,(Vec3b *)&local_120,(uint *)&local_1ab);
    cv::Mat::~Mat((Mat *)local_78);
    local_68.width = 0;
    local_68.height = 0;
    local_78._0_4_ = 0x1010000;
    local_78._8_8_ = (pointer)local_d8;
    cv::imshow((string *)&local_140,(_InputArray *)local_78);
  }
  else {
    segments = imgProcessing::ImgProcessor::getImg((ImgProcessor *)local_1a8);
    local_1b0 = (uint)local_1b0._3_1_ << 0x18;
    local_78._0_4_ = 3;
    imgProcessing::ImgProcessor::drawSegmentsBBoxes
              ((ImgProcessor *)local_d8,(Mat *)local_1a8,
               (vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                *)segments,(Vec3b *)&local_120,&local_1b0);
    local_68.width = 0;
    local_68.height = 0;
    local_78._0_4_ = 0x1010000;
    local_78._8_8_ = (pointer)local_d8;
    cv::imshow((string *)&local_140,(_InputArray *)local_78);
  }
  cv::Mat::~Mat((Mat *)local_d8);
  cv::waitKey(-1);
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::~vector(&local_120);
  cv::Mat::~Mat((Mat *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108.arguments);
  return;
}

Assistant:

App::App(const std::vector<std::string>& arguments)
{
    try
    {
        auto cmdParser = CmdParser(arguments);

        auto const filepath = cmdParser.getFlagValue("file");
        const bool showBinaryImg = cmdParser.hasFlag("binary");

        if (filepath.length() < 1)
        {
            Logger::error("No input file specified");
        }

        auto imgProcessor = ImgProcessor();

        imgProcessor.loadImg(filepath);

        auto letterSegments = imgProcessor.process();

        if (showBinaryImg) {
            auto img = imgProcessor.drawSegmentsBBoxes(
                imgProcessor.getBinarizedImg(),
                letterSegments,
                { 0, 0, 255 },
                3
            );

            cv::imshow(filepath, img);
        } else {
            auto img = imgProcessor.drawSegmentsBBoxes(
                imgProcessor.getImg(),
                letterSegments,
                { 0, 0, 0 },
                3
            );

            cv::imshow(filepath, img);
        }

        cv::waitKey(-1);

    }
    catch(Logger::Exception &e)
    {
        Logger::error("Terminating...", true);
    }
}